

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testharness.h
# Opt level: O2

Tester * __thiscall leveldb::test::Tester::IsOk(Tester *this,Status *s)

{
  ostream *poVar1;
  string local_40;
  
  if (s->state_ != (char *)0x0) {
    poVar1 = std::operator<<((ostream *)&this->field_0x28," ");
    Status::ToString_abi_cxx11_(&local_40,s);
    std::operator<<(poVar1,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    this->ok_ = false;
  }
  return this;
}

Assistant:

Tester& IsOk(const Status& s) {
    if (!s.ok()) {
      ss_ << " " << s.ToString();
      ok_ = false;
    }
    return *this;
  }